

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.cpp
# Opt level: O2

bool __thiscall IntElemDomain<0,_0,_0>::propagate(IntElemDomain<0,_0,_0> *this)

{
  IntView<0> *this_00;
  IntView<0> *this_01;
  uint *puVar1;
  int *piVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  Tint *pTVar8;
  Clause *this_02;
  Lit *pLVar9;
  IntVar *pIVar10;
  IntVar *pIVar11;
  uint *puVar12;
  int i;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  int i_1;
  ulong uVar16;
  ulong uVar17;
  IntView<0> *pIVar18;
  long v;
  iterator i_2;
  
  this_00 = &this->y;
  pIVar10 = (this->y).var;
  uVar16 = (ulong)(pIVar10->min).v;
  this_01 = &this->x;
  do {
    if ((long)(pIVar10->max).v < (long)uVar16) {
      uVar5 = (this_01->var->min).v;
      if (uVar5 != (this_01->var->max).v) {
        return true;
      }
      pIVar18 = (this->a).data;
      pIVar11 = pIVar18[uVar5].var;
      pIVar18 = pIVar18 + uVar5;
      iVar4 = (pIVar11->min).v;
      iVar15 = (pIVar10->min).v;
      if (iVar15 < iVar4) {
        if (so.lazy == true) {
          iVar15 = (*(pIVar11->super_Var).super_Branching._vptr_Branching[8])(pIVar11);
          uVar6 = (*(this_01->var->super_Var).super_Branching._vptr_Branching[10])();
          uVar16 = (ulong)uVar6 << 0x20 | (long)iVar15 << 2 | 3;
          pIVar10 = this_00->var;
        }
        else {
          uVar16 = 0;
        }
        iVar4 = (*(pIVar10->super_Var).super_Branching._vptr_Branching[0xe])
                          (pIVar10,(long)iVar4,uVar16,1);
        if ((char)iVar4 == '\0') {
          return false;
        }
        pIVar10 = this_00->var;
        iVar15 = (pIVar10->min).v;
        pIVar11 = pIVar18->var;
        iVar4 = (pIVar11->min).v;
      }
      if (iVar4 < iVar15) {
        if (so.lazy == true) {
          iVar4 = (*(pIVar10->super_Var).super_Branching._vptr_Branching[8])();
          uVar6 = (*(this_01->var->super_Var).super_Branching._vptr_Branching[10])();
          uVar16 = (ulong)uVar6 << 0x20 | (long)iVar4 << 2 | 3;
          pIVar11 = pIVar18->var;
        }
        else {
          uVar16 = 0;
        }
        iVar4 = (*(pIVar11->super_Var).super_Branching._vptr_Branching[0xe])
                          (pIVar11,(long)iVar15,uVar16,1);
        if ((char)iVar4 == '\0') {
          return false;
        }
        pIVar11 = pIVar18->var;
        pIVar10 = this_00->var;
      }
      iVar4 = (pIVar11->max).v;
      iVar15 = (pIVar10->max).v;
      if (iVar4 < iVar15) {
        if (so.lazy == true) {
          iVar15 = (*(pIVar11->super_Var).super_Branching._vptr_Branching[9])(pIVar11);
          uVar6 = (*(this_01->var->super_Var).super_Branching._vptr_Branching[10])();
          uVar16 = (ulong)uVar6 << 0x20 | (long)iVar15 << 2 | 3;
          pIVar10 = this_00->var;
        }
        else {
          uVar16 = 0;
        }
        iVar4 = (*(pIVar10->super_Var).super_Branching._vptr_Branching[0xf])
                          (pIVar10,(long)iVar4,uVar16,1);
        if ((char)iVar4 == '\0') {
          return false;
        }
        pIVar10 = this_00->var;
        iVar15 = (pIVar10->max).v;
        pIVar11 = pIVar18->var;
        iVar4 = (pIVar11->max).v;
      }
      if (iVar15 < iVar4) {
        if (so.lazy == true) {
          iVar4 = (*(pIVar10->super_Var).super_Branching._vptr_Branching[9])();
          uVar6 = (*(this_01->var->super_Var).super_Branching._vptr_Branching[10])();
          uVar16 = (ulong)uVar6 << 0x20 | (long)iVar4 << 2 | 3;
          pIVar11 = pIVar18->var;
        }
        else {
          uVar16 = 0;
        }
        iVar4 = (*(pIVar11->super_Var).super_Branching._vptr_Branching[0xf])
                          (pIVar11,(long)iVar15,uVar16,1);
        if ((char)iVar4 == '\0') {
          return false;
        }
      }
      pIVar18 = (this->a).data;
      i_2.forward.var = pIVar18[uVar5].var;
      i_2.view = pIVar18 + uVar5;
      i_2.forward.val = ((i_2.forward.var)->min).v;
      do {
        do {
          iVar4 = i_2.forward.val;
          IntVar::iterator::operator++(&i_2.forward);
          v = (long)iVar4;
          bVar3 = IntView<0>::indomain(this_00,v);
        } while (bVar3);
        pIVar18 = (this->a).data;
        if (so.lazy == true) {
          uVar6 = (*(this_00->var->super_Var).super_Branching._vptr_Branching[0xd])
                            (this_00->var,v,0);
          uVar7 = (*(this_01->var->super_Var).super_Branching._vptr_Branching[0xd])
                            (this_01->var,(long)(int)uVar5,1);
          uVar16 = (ulong)(uVar7 ^ 1) << 0x20 | (long)(int)(uVar6 ^ 1) << 2 | 3;
        }
        else {
          uVar16 = 0;
        }
        pIVar10 = pIVar18[uVar5].var;
        iVar4 = (*(pIVar10->super_Var).super_Branching._vptr_Branching[0x11])(pIVar10,v,uVar16,1);
      } while ((char)iVar4 != '\0');
      return false;
    }
    bVar3 = IntView<0>::indomain(this_00,uVar16);
    if (bVar3) {
      pTVar8 = this->num_support;
      puVar1 = (uint *)this->support[uVar16];
      iVar4 = pTVar8[uVar16].v;
      if (iVar4 < 1) {
        uVar17 = 0;
      }
      else {
        bVar3 = IntView<0>::indomain(this_01,(long)(int)*puVar1);
        if ((bVar3) && (bVar3 = IntView<0>::indomain((this->a).data + *puVar1,uVar16), bVar3))
        goto LAB_00184ee1;
        uVar17 = 0;
        do {
          bVar3 = IntView<0>::indomain(this_01,(long)(int)puVar1[uVar17]);
          if ((bVar3) &&
             (bVar3 = IntView<0>::indomain((this->a).data + puVar1[uVar17],uVar16), bVar3)) {
            pTVar8 = this->num_support;
            iVar4 = pTVar8[uVar16].v;
            break;
          }
          uVar17 = uVar17 + 1;
          pTVar8 = this->num_support;
          iVar4 = pTVar8[uVar16].v;
        } while ((long)uVar17 < (long)iVar4);
      }
      iVar15 = (int)uVar17;
      if (iVar15 == iVar4) {
        if (so.lazy == true) {
          this_02 = Reason_new(((this_01->var->max).v - (this_01->var->min).v) + 4);
          iVar4 = (*(this_01->var->super_Var).super_Branching._vptr_Branching[8])();
          pLVar9 = Clause::operator[](this_02,1);
          pLVar9->x = iVar4;
          iVar4 = (*(this_01->var->super_Var).super_Branching._vptr_Branching[9])();
          pLVar9 = Clause::operator[](this_02,2);
          pLVar9->x = iVar4;
          pIVar10 = this_01->var;
          iVar4 = (pIVar10->min).v;
          iVar15 = iVar4 + 3;
          for (uVar17 = (ulong)iVar4; (long)uVar17 <= (long)(pIVar10->max).v; uVar17 = uVar17 + 1) {
            iVar4 = (pIVar10->min).v;
            bVar3 = IntView<0>::indomain(this_01,uVar17);
            uVar13 = uVar17;
            pIVar18 = this_01;
            if (bVar3) {
              uVar13 = uVar16;
              pIVar18 = (this->a).data + (uVar17 & 0xffffffff);
            }
            uVar5 = (*(pIVar18->var->super_Var).super_Branching._vptr_Branching[0xd])
                              (pIVar18->var,uVar13,0);
            pLVar9 = Clause::operator[](this_02,iVar15 - iVar4);
            pLVar9->x = uVar5 ^ 1;
            pIVar10 = (this->x).var;
            iVar15 = iVar15 + 1;
          }
        }
        else {
          this_02 = (Clause *)0x0;
        }
        iVar4 = (*(this_00->var->super_Var).super_Branching._vptr_Branching[0x11])
                          (this_00->var,uVar16,this_02,1);
        if ((char)iVar4 == '\0') {
          return false;
        }
      }
      else {
        piVar2 = this->temp_sup;
        uVar17 = uVar17 & 0xffffffff;
        for (uVar13 = 0; puVar12 = puVar1, uVar14 = uVar17, uVar17 != uVar13; uVar13 = uVar13 + 1) {
          piVar2[uVar13] = puVar1[uVar13];
        }
        for (; iVar4 = pTVar8[uVar16].v, (long)uVar14 < (long)iVar4; uVar14 = uVar14 + 1) {
          *puVar12 = puVar12[uVar17];
          puVar12 = puVar12 + 1;
        }
        piVar2 = this->temp_sup;
        for (uVar13 = 0; uVar17 != uVar13; uVar13 = uVar13 + 1) {
          puVar1[(long)(iVar4 - iVar15) + uVar13] = piVar2[uVar13];
        }
        Tint::operator-=(pTVar8 + uVar16,iVar15);
      }
    }
LAB_00184ee1:
    uVar16 = uVar16 + 1;
    pIVar10 = this_00->var;
  } while( true );
}

Assistant:

bool propagate() override {
		// propagate holes in y
		for (int v = static_cast<int>(y.getMin()); v <= static_cast<int>(y.getMax()); v++) {
			if (!y.indomain(v)) {
				continue;
			}
			int* s = support[v];
			int f = 0;
			if (num_support[v] > 0) {
				if (x.indomain(s[0]) && a[s[0]].indomain(v)) {
					continue;
				}
				while (!(x.indomain(s[f]) && a[s[f]].indomain(v)) && ++f < num_support[v]) {
					;
				}
			}
			if (f == num_support[v]) {
				// v has no support, remove from y
				Clause* r = nullptr;
				if (so.lazy) {
					r = Reason_new(static_cast<int>(x.getMax() + 4 - x.getMin()));
					(*r)[1] = x.getMinLit();
					(*r)[2] = x.getMaxLit();
					for (int i = static_cast<int>(x.getMin()); i <= static_cast<int>(x.getMax()); i++) {
						const int reasonIndex = static_cast<int>(3 + i - x.getMin());
						if (x.indomain(i)) {
							const Lit l = ~a[i].getLit(v, LR_NE);
							(*r)[reasonIndex] = l;
						} else {
							const Lit l = ~x.getLit(i, LR_NE);
							(*r)[reasonIndex] = l;
						}
					}
				}
				if (!y.remVal(v, r)) {
					return false;
				}
			} else {
				// shift bad supports to back
				for (int i = 0; i < f; i++) {
					temp_sup[i] = s[i];
				}
				for (int i = f; i < num_support[v]; i++) {
					s[i - f] = s[i];
				}
				s += num_support[v] - f;
				for (int i = 0; i < f; i++) {
					s[i] = temp_sup[i];
				}
				num_support[v] -= f;
			}
		}

		// propagate holes in x
		// just ignore

		// propagate holes in a_i
		if (x.isFixed()) {
			const int v = static_cast<int>(x.getVal());
			const IntView<W>& f = a[v];
			setDom(y, setMin, f.getMin(), f.getMinLit(), x.getValLit());
			setDom(f, setMin, y.getMin(), y.getMinLit(), x.getValLit());
			setDom(y, setMax, f.getMax(), f.getMaxLit(), x.getValLit());
			setDom(f, setMax, y.getMax(), y.getMaxLit(), x.getValLit());
			for (typename IntView<W>::iterator i = a[v].begin(); i != a[v].end();) {
				const int w = *i++;
				if (!y.indomain(w) &&
						!a[v].remVal(w,
												 so.lazy ? Reason(~y.getLit(w, LR_NE), ~x.getLit(v, LR_EQ)) : Reason())) {
					return false;
				}
			}
		}

		return true;
	}